

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O0

void __thiscall
ASTree::ASTree(ASTree *this,
              stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
              *productions,
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *nonTerminals,string *newRoot,ASTree *parent)

{
  Production *this_00;
  bool bVar1;
  __type _Var2;
  reference ppPVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  ASTree *pAVar7;
  string local_178;
  ASTree *local_158;
  __normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_> local_150;
  const_iterator local_148;
  undefined1 local_140 [8];
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> emptyStack;
  string local_e0;
  ASTree *local_c0;
  __normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_> local_b8;
  const_iterator local_b0;
  _Self local_a8;
  _Self local_a0;
  undefined4 local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string prodToJ;
  int j;
  int totProd;
  Production *production;
  ASTree *parent_local;
  string *newRoot_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *nonTerminals_local;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *productions_local;
  ASTree *this_local;
  
  std::vector<ASTree_*,_std::allocator<ASTree_*>_>::vector(&this->subtrees);
  std::__cxx11::string::string((string *)&this->root,(string *)newRoot);
  this->parent = parent;
  bVar1 = std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::empty
                    (productions);
  if (!bVar1) {
    ppPVar3 = std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::
              top(productions);
    this_00 = *ppPVar3;
    std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::pop
              (productions);
    pvVar4 = Production::getToP_abi_cxx11_(this_00);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar4);
    prodToJ.field_2._12_4_ = (undefined4)sVar5;
    for (prodToJ.field_2._8_4_ = 0; (int)prodToJ.field_2._8_4_ < (int)prodToJ.field_2._12_4_;
        prodToJ.field_2._8_4_ = prodToJ.field_2._8_4_ + 1) {
      pvVar4 = Production::getToP_abi_cxx11_(this_00);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar4,(long)(int)(~prodToJ.field_2._8_4_ + prodToJ.field_2._12_4_));
      std::__cxx11::string::string((string *)local_70,(string *)pvVar6);
      getMarker_abi_cxx11_();
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (_Var2) {
        local_94 = 4;
      }
      else {
        local_a0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(nonTerminals,(key_type *)local_70);
        local_a8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(nonTerminals);
        bVar1 = std::operator!=(&local_a0,&local_a8);
        if (bVar1) {
          local_b8._M_current =
               (ASTree **)std::vector<ASTree_*,_std::allocator<ASTree_*>_>::begin(&this->subtrees);
          __gnu_cxx::__normal_iterator<ASTree*const*,std::vector<ASTree*,std::allocator<ASTree*>>>::
          __normal_iterator<ASTree**>
                    ((__normal_iterator<ASTree*const*,std::vector<ASTree*,std::allocator<ASTree*>>>
                      *)&local_b0,&local_b8);
          pAVar7 = (ASTree *)operator_new(0x40);
          std::__cxx11::string::string((string *)&local_e0,(string *)local_70);
          ASTree(pAVar7,productions,nonTerminals,&local_e0,this);
          local_c0 = pAVar7;
          emptyStack.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               std::vector<ASTree_*,_std::allocator<ASTree_*>_>::insert
                         (&this->subtrees,local_b0,&local_c0);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        else {
          std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>::
          stack<std::deque<Production*,std::allocator<Production*>>,void>
                    ((stack<Production*,std::deque<Production*,std::allocator<Production*>>> *)
                     local_140);
          local_150._M_current =
               (ASTree **)std::vector<ASTree_*,_std::allocator<ASTree_*>_>::begin(&this->subtrees);
          __gnu_cxx::__normal_iterator<ASTree*const*,std::vector<ASTree*,std::allocator<ASTree*>>>::
          __normal_iterator<ASTree**>
                    ((__normal_iterator<ASTree*const*,std::vector<ASTree*,std::allocator<ASTree*>>>
                      *)&local_148,&local_150);
          pAVar7 = (ASTree *)operator_new(0x40);
          std::__cxx11::string::string((string *)&local_178,(string *)local_70);
          ASTree(pAVar7,(stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                         *)local_140,nonTerminals,&local_178,this);
          local_158 = pAVar7;
          std::vector<ASTree_*,_std::allocator<ASTree_*>_>::insert
                    (&this->subtrees,local_148,&local_158);
          std::__cxx11::string::~string((string *)&local_178);
          std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::~stack
                    ((stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                      *)local_140);
        }
        local_94 = 0;
      }
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  return;
}

Assistant:

ASTree::ASTree(std::stack<Production *> &productions, const std::set<std::string> &nonTerminals, std::string newRoot,
               ASTree *parent) : root(newRoot), parent(parent) {

    if (productions.empty()) { return; }

    Production *production = productions.top();
    productions.pop();

//    root = production->getFromP();

    int totProd = production->getToP().size();
    for (int j = 0; j < totProd; ++j) {

        std::string prodToJ = production->getToP()[totProd-j-1];

        if(prodToJ == getMarker()){
            continue;
        }

        if (nonTerminals.find(prodToJ) != nonTerminals.end()) {
            subtrees.insert(subtrees.begin(), new ASTree(productions, nonTerminals, prodToJ, this));
        } else {
            std::stack<Production *> emptyStack;
            subtrees.insert(subtrees.begin(), new ASTree(emptyStack, nonTerminals, prodToJ, this));
        }
    }

    return;
}